

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FBXNodeAttribute.cpp
# Opt level: O0

void __thiscall Assimp::FBX::CameraSwitcher::~CameraSwitcher(CameraSwitcher *this)

{
  CameraSwitcher *this_local;
  
  (this->super_NodeAttribute).super_Object._vptr_Object =
       (_func_int **)&PTR__CameraSwitcher_00ecb338;
  std::__cxx11::string::~string((string *)&this->cameraIndexName);
  std::__cxx11::string::~string((string *)&this->cameraName);
  NodeAttribute::~NodeAttribute(&this->super_NodeAttribute);
  return;
}

Assistant:

CameraSwitcher::~CameraSwitcher()
{
    // empty
}